

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_joystick.c
# Opt level: O0

void pollJoystickEvents(void)

{
  int *piVar1;
  undefined1 local_20 [4];
  short local_1c;
  byte local_1a;
  byte local_19;
  js_event e;
  ssize_t result;
  int i;
  
  for (result._4_4_ = 0; result._4_4_ < 0x10; result._4_4_ = result._4_4_ + 1) {
    if (_glfw.x11.joystick[result._4_4_].present != 0) {
      while( true ) {
        piVar1 = __errno_location();
        *piVar1 = 0;
        e = (js_event)read(_glfw.x11.joystick[result._4_4_].fd,local_20,8);
        piVar1 = __errno_location();
        if (*piVar1 == 0x13) {
          free(_glfw.x11.joystick[result._4_4_].axes);
          free(_glfw.x11.joystick[result._4_4_].buttons);
          free(_glfw.x11.joystick[result._4_4_].name);
          _glfw.x11.joystick[result._4_4_].present = 0;
        }
        if (e == (js_event)0xffffffffffffffff) break;
        local_1a = local_1a & 0x7f;
        if (local_1a == 1) {
          _glfw.x11.joystick[result._4_4_].buttons[local_19] = local_1c != 0;
        }
        else if (local_1a == 2) {
          _glfw.x11.joystick[result._4_4_].axes[local_19] = (float)(int)local_1c / 32767.0;
        }
      }
    }
  }
  return;
}

Assistant:

static void pollJoystickEvents(void)
{
#ifdef __linux__
    int i;
    ssize_t result;
    struct js_event e;

    for (i = 0;  i <= GLFW_JOYSTICK_LAST;  i++)
    {
        if (!_glfw.x11.joystick[i].present)
            continue;

        // Read all queued events (non-blocking)
        for (;;)
        {
            errno = 0;
            result = read(_glfw.x11.joystick[i].fd, &e, sizeof(e));

            if (errno == ENODEV)
            {
                free(_glfw.x11.joystick[i].axes);
                free(_glfw.x11.joystick[i].buttons);
                free(_glfw.x11.joystick[i].name);
                _glfw.x11.joystick[i].present = GL_FALSE;
            }

            if (result == -1)
                break;

            // We don't care if it's an init event or not
            e.type &= ~JS_EVENT_INIT;

            switch (e.type)
            {
                case JS_EVENT_AXIS:
                    _glfw.x11.joystick[i].axes[e.number] =
                        (float) e.value / 32767.0f;
                    break;

                case JS_EVENT_BUTTON:
                    _glfw.x11.joystick[i].buttons[e.number] =
                        e.value ? GLFW_PRESS : GLFW_RELEASE;
                    break;

                default:
                    break;
            }
        }
    }
#endif // __linux__
}